

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TagAlias * __thiscall Catch::TagAliasRegistry::find(TagAliasRegistry *this,string *alias)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  string *alias_local;
  TagAliasRegistry *this_local;
  
  it._M_node = (_Base_ptr)alias;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
       ::find(&this->m_registry,alias);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
       ::end(&this->m_registry);
  bVar1 = std::operator==(&local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (TagAliasRegistry *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
             ::operator->(&local_28);
    this_local = (TagAliasRegistry *)&ppVar2->second;
  }
  return (TagAlias *)this_local;
}

Assistant:

TagAlias const *TagAliasRegistry::find(std::string const &alias) const {
        auto it = m_registry.find(alias);
        if (it != m_registry.end())
            return &(it->second);
        else
            return nullptr;
    }